

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-timed.c
# Opt level: O1

_Bool player_inc_timed(player *p,wchar_t idx,wchar_t v,_Bool notify,_Bool can_disturb,_Bool check)

{
  _Bool _Var1;
  
  if (idx < L'\0') {
    __assert_fail("idx >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-timed.c"
                  ,0x426,"_Bool player_inc_timed(struct player *, int, int, _Bool, _Bool, _Bool)");
  }
  if (L'4' < idx) {
    __assert_fail("idx < TMD_MAX",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-timed.c"
                  ,0x427,"_Bool player_inc_timed(struct player *, int, int, _Bool, _Bool, _Bool)");
  }
  if ((check) && (_Var1 = player_inc_check(p,idx,false), !_Var1)) {
    return false;
  }
  if (((timed_effects[(uint)idx].flags & 1) != 0) && (0 < p->timed[(uint)idx])) {
    return false;
  }
  _Var1 = player_set_timed(p,idx,p->timed[(uint)idx] + v,notify,can_disturb);
  return _Var1;
}

Assistant:

bool player_inc_timed(struct player *p, int idx, int v, bool notify,
		bool can_disturb, bool check)
{
	assert(idx >= 0);
	assert(idx < TMD_MAX);

	if (check == false || player_inc_check(p, idx, false) == true) {
		if ((timed_effects[idx].flags & TMD_FLAG_NONSTACKING)
				&& p->timed[idx] > 0) {
			/*
			 * Block the increase if the effect is nonstacking and
			 * already active.
			 */
			return false;
		} else {
			return player_set_timed(p,
					idx,
					p->timed[idx] + v,
					notify, can_disturb);
		}
	}

	return false;
}